

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetOutputName
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact)

{
  pointer pbVar1;
  iterator iVar2;
  cmake *this_00;
  char *pcVar3;
  pointer prop;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar4;
  string outName;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  string configUpper;
  string type;
  cmGeneratorExpression ge;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  cmListFileBacktrace local_b8;
  value_type entry;
  OutputNameKey key;
  
  std::__cxx11::string::string((string *)&key,(string *)config);
  key.second = artifact;
  iVar2 = std::
          _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->OutputNameMap)._M_t,&key);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header)
  {
    if (iVar2._M_node[2]._M_left == (_Base_ptr)0x0) {
      this_00 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      std::operator+(&type,"Target \'",&this->Target->Name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&entry,
                     &type,"\' OUTPUT_NAME depends on itself.");
      GetBacktrace((cmGeneratorTarget *)&configUpper);
      cmake::IssueMessage(this_00,FATAL_ERROR,(string *)&entry,(cmListFileBacktrace *)&configUpper);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&configUpper._M_string_length);
      std::__cxx11::string::~string((string *)&entry);
      std::__cxx11::string::~string((string *)&type);
    }
    goto LAB_0026fe32;
  }
  std::
  pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>_&,_const_char_(&)[1],_true>
            (&entry,&key,(char (*) [1])0x42ccbe);
  pVar4 = std::
          _Rb_tree<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>,std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>>,std::allocator<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>>>
          ::
          _M_emplace_unique<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>&>
                    ((_Rb_tree<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>,std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>>,std::allocator<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>>>
                      *)&this->OutputNameMap,&entry);
  iVar2._M_node = (_Base_ptr)pVar4.first._M_node;
  props.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  props.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  props.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar3 = GetOutputTargetType(this,artifact);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&type,pcVar3,(allocator<char> *)&configUpper);
  cmsys::SystemTools::UpperCase(&configUpper,config);
  if (type._M_string_length != 0) {
    if (configUpper._M_string_length != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                     &type,"_OUTPUT_NAME_");
      std::operator+(&outName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_d8,&configUpper);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&props,
                 &outName);
      std::__cxx11::string::~string((string *)&outName);
      std::__cxx11::string::~string((string *)local_d8._M_local_buf);
      if (type._M_string_length == 0) goto LAB_0026fc77;
    }
    std::operator+(&outName,&type,"_OUTPUT_NAME");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&props,&outName)
    ;
    std::__cxx11::string::~string((string *)&outName);
  }
LAB_0026fc77:
  if (configUpper._M_string_length != 0) {
    std::operator+(&outName,"OUTPUT_NAME_",&configUpper);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&props,&outName)
    ;
    std::__cxx11::string::~string((string *)&outName);
    std::operator+(&outName,&configUpper,"_OUTPUT_NAME");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&props,&outName)
    ;
    std::__cxx11::string::~string((string *)&outName);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[12]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&props,
             (char (*) [12])0x3f97cc);
  pbVar1 = props.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  outName._M_dataplus._M_p = (pointer)&outName.field_2;
  outName._M_string_length = 0;
  outName.field_2._M_local_buf[0] = '\0';
  prop = props.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (prop == pbVar1) goto LAB_0026fd2f;
    pcVar3 = GetProperty(this,prop);
    prop = prop + 1;
  } while (pcVar3 == (char *)0x0);
  std::__cxx11::string::assign((char *)&outName);
LAB_0026fd2f:
  if (outName._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&outName);
  }
  local_b8.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_b8.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmGeneratorExpression::cmGeneratorExpression(&ge,&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(string *)&ge);
  local_d8._M_allocated_capacity = (size_type)&local_c8;
  local_d8._8_8_ = (_Base_ptr)0x0;
  local_c8._M_local_buf[0] = '\0';
  cmCompiledGeneratorExpression::Evaluate
            ((cmCompiledGeneratorExpression *)
             cge._M_t.
             super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
             .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
             this->LocalGenerator,config,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0,(string *)&local_d8);
  std::__cxx11::string::_M_assign((string *)&iVar2._M_node[2]._M_parent);
  std::__cxx11::string::~string((string *)local_d8._M_local_buf);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&cge);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  std::__cxx11::string::~string((string *)&outName);
  std::__cxx11::string::~string((string *)&configUpper);
  std::__cxx11::string::~string((string *)&type);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&props);
  std::
  pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&entry);
LAB_0026fe32:
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&iVar2._M_node[2]._M_parent);
  std::__cxx11::string::~string((string *)&key);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetOutputName(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  // Lookup/compute/cache the output name for this configuration.
  OutputNameKey key(config, artifact);
  cmGeneratorTarget::OutputNameMapType::iterator i =
    this->OutputNameMap.find(key);
  if (i == this->OutputNameMap.end()) {
    // Add empty name in map to detect potential recursion.
    OutputNameMapType::value_type entry(key, "");
    i = this->OutputNameMap.insert(entry).first;

    // Compute output name.
    std::vector<std::string> props;
    std::string type = this->GetOutputTargetType(artifact);
    std::string configUpper = cmSystemTools::UpperCase(config);
    if (!type.empty() && !configUpper.empty()) {
      // <ARCHIVE|LIBRARY|RUNTIME>_OUTPUT_NAME_<CONFIG>
      props.push_back(type + "_OUTPUT_NAME_" + configUpper);
    }
    if (!type.empty()) {
      // <ARCHIVE|LIBRARY|RUNTIME>_OUTPUT_NAME
      props.push_back(type + "_OUTPUT_NAME");
    }
    if (!configUpper.empty()) {
      // OUTPUT_NAME_<CONFIG>
      props.push_back("OUTPUT_NAME_" + configUpper);
      // <CONFIG>_OUTPUT_NAME
      props.push_back(configUpper + "_OUTPUT_NAME");
    }
    // OUTPUT_NAME
    props.emplace_back("OUTPUT_NAME");

    std::string outName;
    for (std::string const& p : props) {
      if (const char* outNameProp = this->GetProperty(p)) {
        outName = outNameProp;
        break;
      }
    }

    if (outName.empty()) {
      outName = this->GetName();
    }

    // Now evaluate genex and update the previously-prepared map entry.
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(outName);
    i->second = cge->Evaluate(this->LocalGenerator, config);
  } else if (i->second.empty()) {
    // An empty map entry indicates we have been called recursively
    // from the above block.
    this->LocalGenerator->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      "Target '" + this->GetName() + "' OUTPUT_NAME depends on itself.",
      this->GetBacktrace());
  }
  return i->second;
}